

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fBufferTestUtil.cpp
# Opt level: O0

void __thiscall deqp::gles2::Functional::BufferTestUtil::BufferCase::deinit(BufferCase *this)

{
  bool bVar1;
  reference buffers;
  _Self local_20;
  _Self local_18;
  const_iterator bufIter;
  BufferCase *this_local;
  
  bufIter._M_node = (_Base_ptr)this;
  local_18._M_node =
       (_Base_ptr)
       std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::begin
                 (&this->m_allocatedBuffers);
  while( true ) {
    local_20._M_node =
         (_Base_ptr)
         std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                   (&this->m_allocatedBuffers);
    bVar1 = std::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    buffers = std::_Rb_tree_const_iterator<unsigned_int>::operator*(&local_18);
    glu::CallLogWrapper::glDeleteBuffers(&this->super_CallLogWrapper,1,buffers);
    std::_Rb_tree_const_iterator<unsigned_int>::operator++(&local_18,0);
  }
  return;
}

Assistant:

void BufferCase::deinit (void)
{
	for (set<deUint32>::const_iterator bufIter = m_allocatedBuffers.begin(); bufIter != m_allocatedBuffers.end(); bufIter++)
		glDeleteBuffers(1, &(*bufIter));
}